

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::updateMinMaxSizes(QWizardPrivate *this,QWizardLayoutInfo *info)

{
  QWidget *this_00;
  QSize QVar1;
  QSize QVar2;
  QSize QVar3;
  QSize QVar4;
  QSize local_38;
  
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QVar1 = QLayout::totalMinimumSize(&this->mainLayout->super_QLayout);
  QVar2 = QLayout::totalMaximumSize(&this->mainLayout->super_QLayout);
  QVar4 = QVar1;
  local_38 = QVar2;
  if ((info->header == true) &&
     (QVar3 = QWidget::maximumSize(&this->headerWidget->super_QWidget), QVar3.wd.m_i.m_i != 0xffffff
     )) {
    QVar4 = QWidget::maximumSize(&this->headerWidget->super_QWidget);
    local_38 = QWidget::maximumSize(&this->headerWidget->super_QWidget);
  }
  if ((info->watermark == true) && (info->sideWidget == false)) {
    QVar1 = QLayout::totalSizeHint(&this->mainLayout->super_QLayout);
  }
  QVar3 = QWidget::minimumSize(this_00);
  if (this->minimumWidth == QVar3.wd.m_i.m_i) {
    this->minimumWidth = QVar4.wd.m_i.m_i;
    QWidget::setMinimumWidth(this_00,QVar4.wd.m_i.m_i);
  }
  QVar4 = QWidget::minimumSize(this_00);
  if (this->minimumHeight == QVar4.ht.m_i.m_i) {
    this->minimumHeight = QVar1.ht.m_i.m_i;
    QWidget::setMinimumHeight(this_00,QVar1.ht.m_i.m_i);
  }
  QVar4 = QWidget::maximumSize(this_00);
  if (this->maximumWidth == QVar4.wd.m_i.m_i) {
    this->maximumWidth = local_38.wd.m_i.m_i;
    QWidget::setMaximumWidth(this_00,local_38.wd.m_i.m_i);
  }
  QVar4 = QWidget::maximumSize(this_00);
  if (this->maximumHeight != QVar4.ht.m_i.m_i) {
    return;
  }
  this->maximumHeight = QVar2.ht.m_i.m_i;
  QWidget::setMaximumHeight(this_00,QVar2.ht.m_i.m_i);
  return;
}

Assistant:

void QWizardPrivate::updateMinMaxSizes(const QWizardLayoutInfo &info)
{
    Q_Q(QWizard);

    int extraHeight = 0;
#if QT_CONFIG(style_windowsvista)
    if (isVistaThemeEnabled())
        extraHeight = vistaHelper->titleBarSize() + vistaHelper->topOffset(q);
#endif
    QSize minimumSize = mainLayout->totalMinimumSize() + QSize(0, extraHeight);
    QSize maximumSize = mainLayout->totalMaximumSize();
    if (info.header && headerWidget->maximumWidth() != QWIDGETSIZE_MAX) {
        minimumSize.setWidth(headerWidget->maximumWidth());
        maximumSize.setWidth(headerWidget->maximumWidth());
    }
    if (info.watermark && !info.sideWidget) {
        minimumSize.setHeight(mainLayout->totalSizeHint().height());
    }
    if (q->minimumWidth() == minimumWidth) {
        minimumWidth = minimumSize.width();
        q->setMinimumWidth(minimumWidth);
    }
    if (q->minimumHeight() == minimumHeight) {
        minimumHeight = minimumSize.height();
        q->setMinimumHeight(minimumHeight);
    }
    if (q->maximumWidth() == maximumWidth) {
        maximumWidth = maximumSize.width();
        q->setMaximumWidth(maximumWidth);
    }
    if (q->maximumHeight() == maximumHeight) {
        maximumHeight = maximumSize.height();
        q->setMaximumHeight(maximumHeight);
    }
}